

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

void __thiscall
cmCMakePresetsGraph::PrintTestPresetList(cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  pointer pbVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer __k;
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  presets;
  _Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  local_58;
  mapped_type *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (this->TestPresetOrder).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (this->TestPresetOrder).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
             ::at(&this->TestPresets,__k);
    if ((((pmVar2->Unexpanded).super_Preset.Hidden == false) &&
        ((pmVar2->Expanded).super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>.
         _M_payload.super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
         super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged == true)) &&
       ((pmVar2->Expanded).super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>.
        _M_payload.super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0xa0] ==
        '\x01')) {
      local_38 = pmVar2;
      std::
      vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
      ::emplace_back<cmCMakePresetsGraph::Preset_const*>
                ((vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
                  *)&local_58,(Preset **)&local_38);
    }
  }
  if (local_58._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_impl.super__Vector_impl_data._M_finish) {
    printPrecedingNewline(newline);
    std::operator<<((ostream *)&std::cout,"Available test presets:\n\n");
    PrintPresets((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                  *)&local_58);
  }
  std::
  _Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintTestPresetList(
  PrintPrecedingNewline* newline) const
{
  std::vector<const cmCMakePresetsGraph::Preset*> presets;
  for (auto const& p : this->TestPresetOrder) {
    auto const& preset = this->TestPresets.at(p);
    if (!preset.Unexpanded.Hidden && preset.Expanded &&
        preset.Expanded->ConditionResult) {
      presets.push_back(
        static_cast<const cmCMakePresetsGraph::Preset*>(&preset.Unexpanded));
    }
  }

  if (!presets.empty()) {
    printPrecedingNewline(newline);
    std::cout << "Available test presets:\n\n";
    cmCMakePresetsGraph::PrintPresets(presets);
  }
}